

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdgroupsimple.h
# Opt level: O0

void FastPForLib::SIMDGroupSimple<false,_false>::encodeArrayInternal_woRingBuf
               (uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  bool bVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  uint32_t uVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  uint8_t *n_00;
  ulong *in_RCX;
  undefined4 *in_RDX;
  ulong in_RSI;
  __m128i *in_RDI;
  size_t nbytes;
  size_t n_1;
  uint8_t i_2;
  int m;
  __m128i *in128;
  uint8_t *pad8;
  __m128i *initOutDataArea128;
  __m128i *outDataArea128;
  size_t countPadBytes;
  size_t countSelArea8;
  size_t countSelArea8WorstCase;
  int countSels;
  size_t countSelArea8Used;
  uint8_t countQuadsLastBlock;
  size_t maxPos;
  uint32_t mask;
  uint8_t n;
  uint8_t i_1;
  bool even;
  size_t pos;
  size_t j;
  size_t l;
  uint32_t pseudoQuadMax;
  size_t i;
  uint32_t *quadMaxArray;
  size_t countIn128;
  uint8_t *initOutSelArea8;
  uint8_t *outSelArea8;
  uint32_t *outHeader32;
  undefined7 in_stack_ffffffffffffff08;
  int local_dc;
  __m128i *local_d8;
  __m128i *local_d0;
  __m128i *local_c8;
  __m128i *local_c0;
  size_t local_b8;
  size_t local_b0;
  long local_a8;
  int local_9c;
  size_t local_98;
  byte local_89;
  ulong local_88;
  ulong local_80;
  uint local_78;
  byte local_73;
  byte local_72;
  byte local_71;
  ulong local_70;
  long local_68;
  ulong local_60;
  uint local_54;
  ulong local_50;
  void *local_48;
  ulong local_40;
  byte *local_38;
  byte *local_30;
  undefined4 *local_28;
  ulong *local_20;
  ulong local_10;
  __m128i *local_8;
  
  local_38 = (byte *)(in_RDX + 3);
  local_40 = (in_RSI << 2) >> 4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_40;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_30 = local_38;
  local_28 = in_RDX;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_48 = operator_new__(uVar5);
  for (local_50 = 0; local_50 < local_10; local_50 = local_50 + 4) {
    local_54 = *(uint *)((long)*local_8 + local_50 * 4) |
               *(uint *)((long)*local_8 + local_50 * 4 + 4) |
               *(uint *)((long)*local_8 + local_50 * 4 + 8) |
               *(uint *)((long)*local_8 + local_50 * 4 + 0xc);
    *(uint *)((long)local_48 + local_50) = local_54;
  }
  local_60 = local_40;
  local_68 = 0;
  local_70 = 0;
  local_71 = 1;
  do {
    if (local_60 == 0) {
      if (local_71 == 0) {
        local_30 = local_30 + 1;
      }
      local_89 = (byte)local_70;
      *local_30 = local_89;
      if (local_48 != (void *)0x0) {
        operator_delete__(local_48);
      }
      local_b0 = (long)local_30 - (long)local_38;
      local_9c = (int)local_b0 * 2 - (uint)((local_71 & 1) == 0);
      local_a8 = (local_40 >> 1) + (local_40 & 1);
      local_98 = local_b0;
      local_b8 = getCountPadBytes(&local_b0);
      local_c8 = (__m128i *)(local_38 + local_b8 + local_b0 + 1);
      for (local_d0 = (__m128i *)((long)local_c8 - local_b8); local_d0 < local_c8;
          local_d0 = (__m128i *)((long)*local_d0 + 1)) {
        *(byte *)*local_d0 = 0;
      }
      local_d8 = local_8;
      local_c0 = local_c8;
      for (local_dc = 0; local_dc < local_9c + -1; local_dc = local_dc + 1) {
        n_00 = (uint8_t *)(long)local_dc;
        bVar3 = extractSel(&local_38,(size_t *)&stack0xffffffffffffff18);
        comprCompleteBlock(n_00,(__m128i **)
                                (ulong)(byte)SIMDGroupSimple<false,false>::tableNum[bVar3],
                           (__m128i **)
                           CONCAT17(SIMDGroupSimple<false,false>::tableNum[bVar3],
                                    in_stack_ffffffffffffff08));
      }
      if (local_89 != 0) {
        comprIncompleteBlock(&local_89,&local_d8,&local_c0);
      }
      *local_28 = (undefined4)local_10;
      local_28[1] = local_9c;
      local_28[2] = (int)local_b0;
      uVar4 = div_roundup((int)local_b0 + 0xd + (int)local_b8 +
                          (int)((long)local_c0 - (long)local_c8 >> 4) * 0x10,4);
      *local_20 = (ulong)uVar4;
      return;
    }
    for (local_72 = 0; local_72 < 10; local_72 = local_72 + 1) {
      local_73 = SIMDGroupSimple<false,false>::tableNum[local_72];
      local_78 = *(uint *)(SIMDGroupSimple<false,false>::tableMask + (ulong)local_72 * 4);
      local_70 = 0;
      local_88 = (ulong)local_73;
      puVar6 = std::min<unsigned_long>(&local_88,&local_60);
      local_80 = *puVar6;
      while( true ) {
        bVar1 = false;
        if (local_70 < local_80) {
          bVar1 = *(uint *)((long)local_48 + (local_68 + local_70) * 4) <= local_78;
        }
        if (!bVar1) break;
        local_70 = local_70 + 1;
      }
      if (local_70 == local_80) break;
    }
    local_60 = local_60 - local_70;
    local_68 = local_70 + local_68;
    if ((local_71 & 1) == 0) {
      *local_30 = *local_30 | local_72 << 4;
      local_30 = local_30 + 1;
    }
    else {
      *local_30 = local_72;
    }
    local_71 = (local_71 ^ 0xff) & 1;
  } while( true );
}

Assistant:

inline static void encodeArrayInternal_woRingBuf(const uint32_t *in,
                                                         const size_t len,
                                                         uint32_t *out,
                                                         size_t &nvalue) {
            // The start of the header.
            uint32_t *const outHeader32 = out;
            // The start of the selectors area.
            uint8_t *outSelArea8 =
                    reinterpret_cast<uint8_t *>(outHeader32 + countHeader32);
            uint8_t *const initOutSelArea8 = outSelArea8;

            // The number of input quads, i.e., groups of four integers. Note that we
            // assume the number of input integers to be a multiple of four.
            const size_t countIn128 = len * sizeof(uint32_t) / sizeof(__m128i);

            // Step 1: Generation of the quad max array
            // ========================================
            uint32_t *quadMaxArray = new uint32_t[countIn128];
            for (size_t i = 0; i < len; i += 4) {
                const uint32_t pseudoQuadMax = in[i] | in[i + 1] | in[i + 2] | in[i + 3];
                quadMaxArray[i >> 2] = pseudoQuadMax;
            }

            // Step 2: Pattern selection algorithm
            // ===================================
            // As described in the paper.
            size_t l = countIn128;
            size_t j = 0;
            size_t pos = 0;
            // Whether we have an even number of selectors so far.
            bool even = true;
            while (l > 0) {
                uint8_t i;
                for (i = 0; i <= 9; i++) {
                    const uint8_t n = tableNum[i];
                    // Unlike the original pattern selection algorithm, we look up the mask
                    // directly instead of calculating it from a looked up bit width.
                    const uint32_t mask = tableMask[i];
                    pos = 0;
                    const size_t maxPos = std::min(static_cast<size_t>(n), l);
                    while (pos < maxPos && quadMaxArray[j + pos] <= mask)
                        pos++;
                    if (pos == maxPos)
                        break;
                }
                l -= pos;
                j += pos;
                // Store the selector.
                if (even)
                    *outSelArea8 = i;
                else
                    *outSelArea8++ |= (i << 4);
                even = !even;
            }
            if (!even)
                // The last used byte in the selectors area was touched, but not finished.
                outSelArea8++;
            // The number of quads in the last block.
            const uint8_t countQuadsLastBlock = static_cast<uint8_t>(pos);
            *outSelArea8 = countQuadsLastBlock;

            delete[] quadMaxArray;

            // The number of bytes actually used for the selectors area.
            const size_t countSelArea8Used = outSelArea8 - initOutSelArea8;
            // The total number of selectors.
            const int countSels = int(countSelArea8Used * 2 - (even ? 0 : 1));

            // The number of bytes that could be required for the selectors area in the
            // worst case.
            const size_t countSelArea8WorstCase = countIn128 / 2 + (countIn128 & 1);

            // Depending on whether we want to leave the "pessimistic gap" between the
            // selectors area and the data area, we either reserve the true or the
            // worst-case number of bytes for the selectors area. Note that this has no
            // effect on the amount of data that we actually have to write.
            const size_t countSelArea8 =
                    pessimisticGap ? countSelArea8WorstCase : countSelArea8Used;

            const size_t countPadBytes = getCountPadBytes(countSelArea8);
            // The start of the data area.
            __m128i *outDataArea128 = reinterpret_cast<__m128i *>(initOutSelArea8 +
                                                                  countSelArea8 + sizeof(uint8_t) + countPadBytes);
            const __m128i *const initOutDataArea128 = outDataArea128;
            uint8_t *pad8 = (uint8_t *) outDataArea128 - countPadBytes;
            while (pad8 < (uint8_t *) outDataArea128)
                *pad8++ = 0; // clear padding bytes

            const __m128i *in128 = reinterpret_cast<const __m128i *>(in);

            // Step 3: Packing the uncompressed integers
            // =========================================
            // Iterate over the selectors obtained from the pattern selection algorithm
            // and compress the blocks accordingly. The last block is always treated
            // specially, since it might not be "full".
            for (int m = 0; m < countSels - 1; m++) {
                const uint8_t i = extractSel(initOutSelArea8, m);
                const size_t n = tableNum[i];
                comprCompleteBlock(uint8_t(n), in128, outDataArea128);
            }
            if (countQuadsLastBlock)
                comprIncompleteBlock(countQuadsLastBlock, in128, outDataArea128);

            // Write some meta data to the header.
            outHeader32[0] = uint32_t(len);
            outHeader32[1] = uint32_t(countSels);
            outHeader32[2] = uint32_t(countSelArea8);

            // The position of the last byte written to the output relative to the
            // start of the output. Note that the actual number of written bytes might
            // be slightly lower due to the inserted padding. However, it might even be
            // significantly lower, if pessimisticGap is true.
            const size_t nbytes = countHeader32 * sizeof(uint32_t) +
                                  countSelArea8 + sizeof(uint8_t) + countPadBytes +
                                  (outDataArea128 - initOutDataArea128) * sizeof(__m128i);
            // Rounding the number of bytes to full 32-bit integers.
            nvalue = div_roundup(uint32_t(nbytes), sizeof(uint32_t));
        }